

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void round_shift_8x8(__m128i *in,int shift)

{
  int iVar1;
  int iVar2;
  longlong lVar3;
  longlong lVar4;
  longlong lVar5;
  longlong lVar6;
  longlong lVar7;
  longlong lVar8;
  longlong lVar9;
  int iVar10;
  __m128i rnding;
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  
  if (shift != 0) {
    iVar10 = 1 << ((char)shift - 1U & 0x1f);
    iVar1 = *(int *)((long)*in + 4);
    lVar3 = (*in)[1];
    iVar2 = *(int *)((long)*in + 0xc);
    lVar4 = in[1][0];
    iVar12 = *(int *)((long)in[1] + 4);
    lVar5 = in[1][1];
    iVar13 = *(int *)((long)in[1] + 0xc);
    lVar6 = in[2][0];
    iVar14 = *(int *)((long)in[2] + 4);
    lVar7 = in[2][1];
    iVar15 = *(int *)((long)in[2] + 0xc);
    lVar8 = in[3][0];
    iVar16 = *(int *)((long)in[3] + 4);
    lVar9 = in[3][1];
    iVar17 = *(int *)((long)in[3] + 0xc);
    auVar11 = ZEXT416((uint)shift);
    *(int *)*in = (int)(*in)[0] + iVar10 >> auVar11;
    *(int *)((long)*in + 4) = iVar1 + iVar10 >> auVar11;
    *(int *)(*in + 1) = (int)lVar3 + iVar10 >> auVar11;
    *(int *)((long)*in + 0xc) = iVar2 + iVar10 >> auVar11;
    *(int *)in[1] = (int)lVar4 + iVar10 >> auVar11;
    *(int *)((long)in[1] + 4) = iVar12 + iVar10 >> auVar11;
    *(int *)(in[1] + 1) = (int)lVar5 + iVar10 >> auVar11;
    *(int *)((long)in[1] + 0xc) = iVar13 + iVar10 >> auVar11;
    *(int *)in[2] = (int)lVar6 + iVar10 >> auVar11;
    *(int *)((long)in[2] + 4) = iVar14 + iVar10 >> auVar11;
    *(int *)(in[2] + 1) = (int)lVar7 + iVar10 >> auVar11;
    *(int *)((long)in[2] + 0xc) = iVar15 + iVar10 >> auVar11;
    *(int *)in[3] = (int)lVar8 + iVar10 >> auVar11;
    *(int *)((long)in[3] + 4) = iVar16 + iVar10 >> auVar11;
    *(int *)(in[3] + 1) = (int)lVar9 + iVar10 >> auVar11;
    *(int *)((long)in[3] + 0xc) = iVar17 + iVar10 >> auVar11;
    iVar1 = *(int *)((long)in[4] + 4);
    lVar3 = in[4][1];
    iVar2 = *(int *)((long)in[4] + 0xc);
    lVar4 = in[5][0];
    iVar12 = *(int *)((long)in[5] + 4);
    lVar5 = in[5][1];
    iVar13 = *(int *)((long)in[5] + 0xc);
    lVar6 = in[6][0];
    iVar14 = *(int *)((long)in[6] + 4);
    lVar7 = in[6][1];
    iVar15 = *(int *)((long)in[6] + 0xc);
    lVar8 = in[7][0];
    iVar16 = *(int *)((long)in[7] + 4);
    lVar9 = in[7][1];
    iVar17 = *(int *)((long)in[7] + 0xc);
    *(int *)in[4] = (int)in[4][0] + iVar10 >> auVar11;
    *(int *)((long)in[4] + 4) = iVar1 + iVar10 >> auVar11;
    *(int *)(in[4] + 1) = (int)lVar3 + iVar10 >> auVar11;
    *(int *)((long)in[4] + 0xc) = iVar2 + iVar10 >> auVar11;
    *(int *)in[5] = (int)lVar4 + iVar10 >> auVar11;
    *(int *)((long)in[5] + 4) = iVar12 + iVar10 >> auVar11;
    *(int *)(in[5] + 1) = (int)lVar5 + iVar10 >> auVar11;
    *(int *)((long)in[5] + 0xc) = iVar13 + iVar10 >> auVar11;
    *(int *)in[6] = (int)lVar6 + iVar10 >> auVar11;
    *(int *)((long)in[6] + 4) = iVar14 + iVar10 >> auVar11;
    *(int *)(in[6] + 1) = (int)lVar7 + iVar10 >> auVar11;
    *(int *)((long)in[6] + 0xc) = iVar15 + iVar10 >> auVar11;
    *(int *)in[7] = (int)lVar8 + iVar10 >> auVar11;
    *(int *)((long)in[7] + 4) = iVar16 + iVar10 >> auVar11;
    *(int *)(in[7] + 1) = (int)lVar9 + iVar10 >> auVar11;
    *(int *)((long)in[7] + 0xc) = iVar17 + iVar10 >> auVar11;
    iVar12 = (int)in[8][0] + iVar10;
    iVar13 = *(int *)((long)in[8] + 4) + iVar10;
    iVar14 = (int)in[8][1] + iVar10;
    iVar15 = *(int *)((long)in[8] + 0xc) + iVar10;
    *(int *)in[8] = iVar12;
    *(int *)((long)in[8] + 4) = iVar13;
    *(int *)(in[8] + 1) = iVar14;
    *(int *)((long)in[8] + 0xc) = iVar15;
    iVar16 = (int)in[9][0] + iVar10;
    iVar17 = *(int *)((long)in[9] + 4) + iVar10;
    iVar18 = (int)in[9][1] + iVar10;
    iVar19 = *(int *)((long)in[9] + 0xc) + iVar10;
    *(int *)in[9] = iVar16;
    *(int *)((long)in[9] + 4) = iVar17;
    *(int *)(in[9] + 1) = iVar18;
    *(int *)((long)in[9] + 0xc) = iVar19;
    iVar20 = (int)in[10][0] + iVar10;
    iVar21 = *(int *)((long)in[10] + 4) + iVar10;
    iVar22 = (int)in[10][1] + iVar10;
    iVar23 = *(int *)((long)in[10] + 0xc) + iVar10;
    *(int *)in[10] = iVar20;
    *(int *)((long)in[10] + 4) = iVar21;
    *(int *)(in[10] + 1) = iVar22;
    *(int *)((long)in[10] + 0xc) = iVar23;
    lVar3 = in[0xb][0];
    iVar1 = *(int *)((long)in[0xb] + 4);
    lVar4 = in[0xb][1];
    iVar2 = *(int *)((long)in[0xb] + 0xc);
    *(int *)in[8] = iVar12 >> auVar11;
    *(int *)((long)in[8] + 4) = iVar13 >> auVar11;
    *(int *)(in[8] + 1) = iVar14 >> auVar11;
    *(int *)((long)in[8] + 0xc) = iVar15 >> auVar11;
    *(int *)in[9] = iVar16 >> auVar11;
    *(int *)((long)in[9] + 4) = iVar17 >> auVar11;
    *(int *)(in[9] + 1) = iVar18 >> auVar11;
    *(int *)((long)in[9] + 0xc) = iVar19 >> auVar11;
    *(int *)in[10] = iVar20 >> auVar11;
    *(int *)((long)in[10] + 4) = iVar21 >> auVar11;
    *(int *)(in[10] + 1) = iVar22 >> auVar11;
    *(int *)((long)in[10] + 0xc) = iVar23 >> auVar11;
    *(int *)in[0xb] = (int)lVar3 + iVar10 >> auVar11;
    *(int *)((long)in[0xb] + 4) = iVar1 + iVar10 >> auVar11;
    *(int *)(in[0xb] + 1) = (int)lVar4 + iVar10 >> auVar11;
    *(int *)((long)in[0xb] + 0xc) = iVar2 + iVar10 >> auVar11;
    iVar12 = (int)in[0xc][0] + iVar10;
    iVar13 = *(int *)((long)in[0xc] + 4) + iVar10;
    iVar14 = (int)in[0xc][1] + iVar10;
    iVar15 = *(int *)((long)in[0xc] + 0xc) + iVar10;
    *(int *)in[0xc] = iVar12;
    *(int *)((long)in[0xc] + 4) = iVar13;
    *(int *)(in[0xc] + 1) = iVar14;
    *(int *)((long)in[0xc] + 0xc) = iVar15;
    iVar16 = (int)in[0xd][0] + iVar10;
    iVar17 = *(int *)((long)in[0xd] + 4) + iVar10;
    iVar18 = (int)in[0xd][1] + iVar10;
    iVar19 = *(int *)((long)in[0xd] + 0xc) + iVar10;
    *(int *)in[0xd] = iVar16;
    *(int *)((long)in[0xd] + 4) = iVar17;
    *(int *)(in[0xd] + 1) = iVar18;
    *(int *)((long)in[0xd] + 0xc) = iVar19;
    iVar20 = (int)in[0xe][0] + iVar10;
    iVar21 = *(int *)((long)in[0xe] + 4) + iVar10;
    iVar22 = (int)in[0xe][1] + iVar10;
    iVar23 = *(int *)((long)in[0xe] + 0xc) + iVar10;
    *(int *)in[0xe] = iVar20;
    *(int *)((long)in[0xe] + 4) = iVar21;
    *(int *)(in[0xe] + 1) = iVar22;
    *(int *)((long)in[0xe] + 0xc) = iVar23;
    lVar3 = in[0xf][0];
    iVar1 = *(int *)((long)in[0xf] + 4);
    lVar4 = in[0xf][1];
    iVar2 = *(int *)((long)in[0xf] + 0xc);
    *(int *)in[0xc] = iVar12 >> auVar11;
    *(int *)((long)in[0xc] + 4) = iVar13 >> auVar11;
    *(int *)(in[0xc] + 1) = iVar14 >> auVar11;
    *(int *)((long)in[0xc] + 0xc) = iVar15 >> auVar11;
    *(int *)in[0xd] = iVar16 >> auVar11;
    *(int *)((long)in[0xd] + 4) = iVar17 >> auVar11;
    *(int *)(in[0xd] + 1) = iVar18 >> auVar11;
    *(int *)((long)in[0xd] + 0xc) = iVar19 >> auVar11;
    *(int *)in[0xe] = iVar20 >> auVar11;
    *(int *)((long)in[0xe] + 4) = iVar21 >> auVar11;
    *(int *)(in[0xe] + 1) = iVar22 >> auVar11;
    *(int *)((long)in[0xe] + 0xc) = iVar23 >> auVar11;
    *(int *)in[0xf] = iVar10 + (int)lVar3 >> auVar11;
    *(int *)((long)in[0xf] + 4) = iVar10 + iVar1 >> auVar11;
    *(int *)(in[0xf] + 1) = iVar10 + (int)lVar4 >> auVar11;
    *(int *)((long)in[0xf] + 0xc) = iVar10 + iVar2 >> auVar11;
  }
  return;
}

Assistant:

static inline void round_shift_4x4(__m128i *in, int shift) {
  if (shift != 0) {
    __m128i rnding = _mm_set1_epi32(1 << (shift - 1));
    in[0] = _mm_add_epi32(in[0], rnding);
    in[1] = _mm_add_epi32(in[1], rnding);
    in[2] = _mm_add_epi32(in[2], rnding);
    in[3] = _mm_add_epi32(in[3], rnding);

    in[0] = _mm_srai_epi32(in[0], shift);
    in[1] = _mm_srai_epi32(in[1], shift);
    in[2] = _mm_srai_epi32(in[2], shift);
    in[3] = _mm_srai_epi32(in[3], shift);
  }
}